

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseBoundValueTypeList
          (WastParser *this,TokenType token,TypeVector *types,BindingHash *bindings,
          Index binding_index_offset)

{
  bool bVar1;
  Result RVar2;
  size_type sVar3;
  Binding local_b0;
  uint local_88;
  Enum local_84;
  undefined1 local_80 [8];
  Location loc;
  undefined1 local_58 [4];
  Type type;
  string name;
  Index binding_index_offset_local;
  BindingHash *bindings_local;
  TypeVector *types_local;
  TokenType token_local;
  WastParser *this_local;
  
  do {
    bVar1 = MatchLpar(this,token);
    if (!bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Ok);
      return (Result)this_local._4_4_;
    }
    bVar1 = PeekMatch(this,Last_String);
    if (bVar1) {
      std::__cxx11::string::string((string *)local_58);
      GetLocation((Location *)local_80,this);
      ParseBindVarOpt(this,(string *)local_58);
      local_84 = (Enum)ParseValueType(this,(Type *)((long)&loc.field_1 + 0xc));
      bVar1 = Failed((Result)local_84);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        sVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(types);
        Binding::Binding(&local_b0,(Location *)local_80,binding_index_offset + (int)sVar3);
        std::
        unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
        ::emplace<std::__cxx11::string&,wabt::Binding>
                  ((unordered_multimap<std::__cxx11::string,wabt::Binding,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,wabt::Binding>>>
                    *)bindings,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                   &local_b0);
        std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                  (types,(value_type *)((long)&loc.field_1 + 0xc));
      }
      local_88 = (uint)bVar1;
      std::__cxx11::string::~string((string *)local_58);
      if (local_88 != 0) {
        return (Result)this_local._4_4_;
      }
    }
    else {
      RVar2 = ParseValueTypeList(this,types);
      bVar1 = Failed(RVar2);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
    }
    RVar2 = Expect(this,Rpar);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseBoundValueTypeList(TokenType token,
                                           TypeVector* types,
                                           BindingHash* bindings,
                                           Index binding_index_offset) {
  WABT_TRACE(ParseBoundValueTypeList);
  while (MatchLpar(token)) {
    if (PeekMatch(TokenType::Var)) {
      std::string name;
      Type type;
      Location loc = GetLocation();
      ParseBindVarOpt(&name);
      CHECK_RESULT(ParseValueType(&type));
      bindings->emplace(name,
                        Binding(loc, binding_index_offset + types->size()));
      types->push_back(type);
    } else {
      CHECK_RESULT(ParseValueTypeList(types));
    }
    EXPECT(Rpar);
  }
  return Result::Ok;
}